

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void finish_productions(Grammar *g)

{
  uint uVar1;
  Production *p;
  Rule *r;
  Elem *pEVar2;
  Rule *rr;
  Production *pp;
  Grammar *g_local;
  
  p = *(g->productions).v;
  r = new_rule(g,p);
  if ((r->elems).v == (Elem **)0x0) {
    pEVar2 = new_elem_nterm((Production *)0x0,r);
    (r->elems).v = (r->elems).e;
    uVar1 = (r->elems).n;
    (r->elems).n = uVar1 + 1;
    (r->elems).e[uVar1] = pEVar2;
  }
  else if ((r->elems).v == (r->elems).e) {
    if ((r->elems).n < 3) {
      pEVar2 = new_elem_nterm((Production *)0x0,r);
      uVar1 = (r->elems).n;
      (r->elems).n = uVar1 + 1;
      (r->elems).v[uVar1] = pEVar2;
    }
    else {
LAB_0013fdff:
      pEVar2 = new_elem_nterm((Production *)0x0,r);
      vec_add_internal(&r->elems,pEVar2);
    }
  }
  else {
    if (((r->elems).n & 7) == 0) goto LAB_0013fdff;
    pEVar2 = new_elem_nterm((Production *)0x0,r);
    uVar1 = (r->elems).n;
    (r->elems).n = uVar1 + 1;
    (r->elems).v[uVar1] = pEVar2;
  }
  if ((p->rules).v == (Rule **)0x0) {
    (p->rules).v = (p->rules).e;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = r;
  }
  else {
    if ((p->rules).v == (p->rules).e) {
      if ((p->rules).n < 3) {
        uVar1 = (p->rules).n;
        (p->rules).n = uVar1 + 1;
        (p->rules).v[uVar1] = r;
        goto LAB_0013fef6;
      }
    }
    else if (((p->rules).n & 7) != 0) {
      uVar1 = (p->rules).n;
      (p->rules).n = uVar1 + 1;
      (p->rules).v[uVar1] = r;
      goto LAB_0013fef6;
    }
    vec_add_internal(&p->rules,r);
  }
LAB_0013fef6:
  ((*(r->elems).v)->e).nterm = (g->productions).v[1];
  return;
}

Assistant:

void finish_productions(Grammar *g) {
  Production *pp = g->productions.v[0];
  Rule *rr = new_rule(g, pp);
  vec_add(&rr->elems, new_elem_nterm(NULL, rr));
  vec_add(&pp->rules, rr);
  rr->elems.v[0]->e.nterm = g->productions.v[1];
}